

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O2

Matrix * __thiscall
QPDFPageObjectHelper::getMatrixForTransformations
          (Matrix *__return_storage_ptr__,QPDFPageObjectHelper *this,bool invert)

{
  bool bVar1;
  int iVar2;
  undefined8 extraout_XMM0_Qb;
  QPDFObjectHandle scale_obj;
  QPDFObjectHandle rotate_obj;
  Rectangle rect;
  QPDFObjectHandle bbox;
  allocator<char> local_99;
  double local_98;
  undefined8 uStack_90;
  undefined1 local_88 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  Rectangle local_68;
  double local_48;
  double dStack_40;
  
  __return_storage_ptr__->a = 1.0;
  __return_storage_ptr__->b = 0.0;
  __return_storage_ptr__->c = 0.0;
  __return_storage_ptr__->d = 1.0;
  __return_storage_ptr__->e = 0.0;
  __return_storage_ptr__->f = 0.0;
  getTrimBox((QPDFPageObjectHelper *)&stack0xffffffffffffffd0,SUB81(this,0),false);
  bVar1 = QPDFObjectHandle::isRectangle((QPDFObjectHandle *)&stack0xffffffffffffffd0);
  if (!bVar1) goto LAB_001a7d7f;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"/Rotate",(allocator<char> *)local_88);
  getAttribute((QPDFPageObjectHelper *)(local_88 + 0x10),(string *)this,SUB81(&local_68,0));
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"/UserUnit",&local_99);
  getAttribute((QPDFPageObjectHelper *)local_88,(string *)this,SUB81(&local_68,0));
  std::__cxx11::string::~string((string *)&local_68);
  bVar1 = QPDFObjectHandle::isNull((QPDFObjectHandle *)(local_88 + 0x10));
  if (bVar1) {
    bVar1 = QPDFObjectHandle::isNull((QPDFObjectHandle *)local_88);
    if (!bVar1) goto LAB_001a7bd5;
  }
  else {
LAB_001a7bd5:
    QPDFObjectHandle::getArrayAsRectangle(&local_68,(QPDFObjectHandle *)&stack0xffffffffffffffd0);
    local_48 = local_68.urx - local_68.llx;
    dStack_40 = local_68.ury - local_68.lly;
    bVar1 = QPDFObjectHandle::isNumber((QPDFObjectHandle *)local_88);
    if (bVar1) {
      local_98 = QPDFObjectHandle::getNumericValue((QPDFObjectHandle *)local_88);
      uStack_90 = extraout_XMM0_Qb;
    }
    else {
      local_98 = 1.0;
      uStack_90 = 0;
    }
    bVar1 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)(local_88 + 0x10));
    iVar2 = 0;
    if (bVar1) {
      iVar2 = QPDFObjectHandle::getIntValueAsInt((QPDFObjectHandle *)(local_88 + 0x10));
    }
    if (invert) {
      if ((local_98 == 0.0) && (!NAN(local_98))) goto LAB_001a7d6b;
      local_98 = 1.0 / local_98;
      iVar2 = 0x168 - iVar2;
      uStack_90 = 0;
    }
    if (iVar2 == 0x10e) {
      __return_storage_ptr__->a = 0.0;
      __return_storage_ptr__->b = local_98;
      __return_storage_ptr__->c = -local_98;
      __return_storage_ptr__->d = 0.0;
      __return_storage_ptr__->e = dStack_40 * local_98;
      __return_storage_ptr__->f = 0.0;
    }
    else if (iVar2 == 0xb4) {
      __return_storage_ptr__->a = -local_98;
      __return_storage_ptr__->b = 0.0;
      __return_storage_ptr__->c = 0.0;
      __return_storage_ptr__->d = -local_98;
      __return_storage_ptr__->e = local_48 * local_98;
      __return_storage_ptr__->f = dStack_40 * local_98;
    }
    else if (iVar2 == 0x5a) {
      __return_storage_ptr__->a = 0.0;
      __return_storage_ptr__->b = -local_98;
      __return_storage_ptr__->c = local_98;
      __return_storage_ptr__->d = 0.0;
      __return_storage_ptr__->e = 0.0;
      __return_storage_ptr__->f = local_48 * local_98;
    }
    else {
      __return_storage_ptr__->a = local_98;
      __return_storage_ptr__->b = 0.0;
      __return_storage_ptr__->c = 0.0;
      __return_storage_ptr__->d = local_98;
      __return_storage_ptr__->e = 0.0;
      __return_storage_ptr__->f = 0.0;
    }
  }
LAB_001a7d6b:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70);
LAB_001a7d7f:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd8);
  return __return_storage_ptr__;
}

Assistant:

QPDFObjectHandle::Matrix
QPDFPageObjectHelper::getMatrixForTransformations(bool invert)
{
    QPDFObjectHandle::Matrix matrix(1, 0, 0, 1, 0, 0);
    QPDFObjectHandle bbox = getTrimBox(false);
    if (!bbox.isRectangle()) {
        return matrix;
    }
    QPDFObjectHandle rotate_obj = getAttribute("/Rotate", false);
    QPDFObjectHandle scale_obj = getAttribute("/UserUnit", false);
    if (!(rotate_obj.isNull() && scale_obj.isNull())) {
        QPDFObjectHandle::Rectangle rect = bbox.getArrayAsRectangle();
        double width = rect.urx - rect.llx;
        double height = rect.ury - rect.lly;
        double scale = (scale_obj.isNumber() ? scale_obj.getNumericValue() : 1.0);
        int rotate = (rotate_obj.isInteger() ? rotate_obj.getIntValueAsInt() : 0);
        if (invert) {
            if (scale == 0.0) {
                return matrix;
            }
            scale = 1.0 / scale;
            rotate = 360 - rotate;
        }

        // Ignore invalid rotation angle
        switch (rotate) {
        case 90:
            matrix = QPDFObjectHandle::Matrix(0, -scale, scale, 0, 0, width * scale);
            break;
        case 180:
            matrix = QPDFObjectHandle::Matrix(-scale, 0, 0, -scale, width * scale, height * scale);
            break;
        case 270:
            matrix = QPDFObjectHandle::Matrix(0, scale, -scale, 0, height * scale, 0);
            break;
        default:
            matrix = QPDFObjectHandle::Matrix(scale, 0, 0, scale, 0, 0);
            break;
        }
    }
    return matrix;
}